

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall Model::Model(Model *this,double cell_volume)

{
  _Rb_tree_header *p_Var1;
  SpeciesTracker *this_00;
  Gillespie local_88;
  
  (this->gillespie_).time_ = 0.0;
  (this->gillespie_).iteration_ = 0;
  (this->super_enable_shared_from_this<Model>)._M_weak_this.
  super___weak_ptr<Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Model>)._M_weak_this.
  super___weak_ptr<Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->gillespie_).initialized_ = false;
  (this->gillespie_).alpha_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gillespie_).alpha_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gillespie_).alpha_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->gillespie_).alpha_sum_ = 0.0;
  (this->gillespie_).reactions_.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gillespie_).reactions_.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gillespie_).reactions_.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->genomes_).
  super__Vector_base<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->genomes_).
  super__Vector_base<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->genomes_).
  super__Vector_base<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transcripts_).
  super__Vector_base<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transcripts_).
  super__Vector_base<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transcripts_).
  super__Vector_base<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->polymerases_).super__Vector_base<Polymerase,_std::allocator<Polymerase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->polymerases_).super__Vector_base<Polymerase,_std::allocator<Polymerase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->polymerases_).super__Vector_base<Polymerase,_std::allocator<Polymerase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->cell_volume_ = cell_volume;
  this->initialized_ = false;
  p_Var1 = &(this->terminations_)._M_t._M_impl.super__Rb_tree_header;
  (this->terminations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->terminations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->terminations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->terminations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->terminations_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = SpeciesTracker::Instance();
  SpeciesTracker::Clear(this_00);
  local_88.reactions_.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.reactions_.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.alpha_sum_ = 0.0;
  local_88.reactions_.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.alpha_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.alpha_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.iteration_ = 0;
  local_88._20_4_ = 0;
  local_88.alpha_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.initialized_ = false;
  local_88._1_7_ = 0;
  local_88.time_ = 0.0;
  Gillespie::operator=(&this->gillespie_,&local_88);
  Gillespie::~Gillespie(&local_88);
  Signal<std::shared_ptr<Reaction>_>::ConnectMember<Gillespie>
            (&this_00->propensity_signal_,&this->gillespie_,0x126f38);
  return;
}

Assistant:

Model::Model(double cell_volume) : cell_volume_(cell_volume) {
  auto &tracker = SpeciesTracker::Instance();
  tracker.Clear();
  gillespie_ = Gillespie();
  tracker.propensity_signal_.ConnectMember(&gillespie_,
                                           &Gillespie::UpdatePropensity);
}